

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Reverb::reset(V2Reverb *this)

{
  int local_1c;
  int local_18;
  int i_1;
  int i;
  int ch;
  V2Reverb *this_local;
  
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      V2Delay::reset((V2Delay *)(this->gaina + (long)i_1 * 0x10 + (long)local_18 * 4 + 6));
      this->combl[i_1][local_18] = 0.0;
    }
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      V2Delay::reset((V2Delay *)(this->combl + (long)i_1 * 2 + (long)local_1c + 2));
    }
    this->hpf[i_1] = 0.0;
  }
  return;
}

Assistant:

void reset()
    {
        for (int ch=0; ch < 2; ch++)
        {
            // comb
            for (int i=0; i < 4; i++)
            {
                combd[ch][i].reset();
                combl[ch][i] = 0.0f;
            }

            // allpass
            for (int i=0; i < 2; i++)
                alld[ch][i].reset();

            // low cut
            hpf[ch] = 0.0f;
        }
    }